

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformApiTests.cpp
# Opt level: O2

UniformCollection *
deqp::gles3::Functional::anon_unknown_1::UniformCollection::nestedArraysStructs
          (DataType type0,DataType type1,char *nameSuffix)

{
  StructType *this;
  UniformCollection *pUVar1;
  StructType *this_00;
  StructType *this_01;
  DataType basicType;
  Precision precision;
  Precision precision_00;
  allocator<char> local_e9;
  Uniform local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  StructType *local_90;
  ulong local_88;
  char *local_80;
  ulong local_78;
  UniformCollection *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  VarType local_48;
  
  pUVar1 = (UniformCollection *)operator_new(0x30);
  (pUVar1->m_uniforms).
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pUVar1->m_uniforms).
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pUVar1->m_uniforms).
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pUVar1->m_structTypes).
  super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pUVar1->m_structTypes).
  super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pUVar1->m_structTypes).
  super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88 = (ulong)type0;
  local_90 = (StructType *)operator_new(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"structType",(allocator<char> *)&local_68);
  std::operator+(&local_e8.name,&local_b0,nameSuffix);
  local_78 = (ulong)type1;
  glu::StructType::StructType(local_90,local_e8.name._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_b0);
  this_00 = (StructType *)operator_new(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"subStructType",(allocator<char> *)&local_68);
  std::operator+(&local_e8.name,&local_b0,nameSuffix);
  local_80 = nameSuffix;
  glu::StructType::StructType(this_00,local_e8.name._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_b0);
  this_01 = (StructType *)operator_new(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"subSubStructType",(allocator<char> *)&local_68);
  std::operator+(&local_e8.name,&local_b0,local_80);
  glu::StructType::StructType(this_01,local_e8.name._M_dataplus._M_p);
  precision = (uint)(type0 - TYPE_BOOL < 4) * 2 + PRECISION_MEDIUMP;
  local_70 = pUVar1;
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_b0);
  glu::VarType::VarType((VarType *)&local_e8,(DataType)local_88,precision);
  glu::StructType::addMember(this_01,"mss0",(VarType *)&local_e8);
  precision_00 = (uint)(type1 - TYPE_BOOL < 4) * 2 + PRECISION_MEDIUMP;
  glu::VarType::~VarType((VarType *)&local_e8);
  basicType = (DataType)local_78;
  glu::VarType::VarType((VarType *)&local_e8,basicType,precision_00);
  glu::StructType::addMember(this_01,"mss1",(VarType *)&local_e8);
  glu::VarType::~VarType((VarType *)&local_e8);
  glu::VarType::VarType((VarType *)&local_e8,basicType,precision_00);
  glu::StructType::addMember(this_00,"ms0",(VarType *)&local_e8);
  glu::VarType::~VarType((VarType *)&local_e8);
  glu::VarType::VarType((VarType *)&local_b0,(DataType)local_88,precision);
  glu::VarType::VarType((VarType *)&local_e8,(VarType *)&local_b0,2);
  pUVar1 = local_70;
  glu::StructType::addMember(this_00,"ms1",(VarType *)&local_e8);
  glu::VarType::~VarType((VarType *)&local_e8);
  glu::VarType::~VarType((VarType *)&local_b0);
  glu::VarType::VarType((VarType *)&local_b0,this_01);
  glu::VarType::VarType((VarType *)&local_e8,(VarType *)&local_b0,2);
  glu::StructType::addMember(this_00,"ms2",(VarType *)&local_e8);
  glu::VarType::~VarType((VarType *)&local_e8);
  glu::VarType::~VarType((VarType *)&local_b0);
  glu::VarType::VarType((VarType *)&local_e8,(DataType)local_88,precision);
  this = local_90;
  glu::StructType::addMember(local_90,"m0",(VarType *)&local_e8);
  glu::VarType::~VarType((VarType *)&local_e8);
  glu::VarType::VarType((VarType *)&local_e8,this_00);
  glu::StructType::addMember(this,"m1",(VarType *)&local_e8);
  glu::VarType::~VarType((VarType *)&local_e8);
  glu::VarType::VarType((VarType *)&local_e8,(DataType)local_78,precision_00);
  glu::StructType::addMember(this,"m2",(VarType *)&local_e8);
  glu::VarType::~VarType((VarType *)&local_e8);
  addStructType(pUVar1,this_01);
  addStructType(pUVar1,this_00);
  addStructType(pUVar1,this);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"u_var",&local_e9);
  std::operator+(&local_b0,&local_68,local_80);
  glu::VarType::VarType(&local_48,this);
  anon_unknown_1::Uniform::Uniform(&local_e8,local_b0._M_dataplus._M_p,&local_48);
  addUniform(pUVar1,&local_e8);
  anon_unknown_1::Uniform::~Uniform(&local_e8);
  glu::VarType::~VarType(&local_48);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_68);
  return pUVar1;
}

Assistant:

static UniformCollection* nestedArraysStructs (const glu::DataType type0, const glu::DataType type1, const char* const nameSuffix = "")
	{
		UniformCollection* const res		= new UniformCollection;
		const glu::Precision prec0			= glu::isDataTypeBoolOrBVec(type0) ? glu::PRECISION_LAST : glu::PRECISION_MEDIUMP;
		const glu::Precision prec1			= glu::isDataTypeBoolOrBVec(type1) ? glu::PRECISION_LAST : glu::PRECISION_MEDIUMP;
		StructType* const structType		= new StructType((string("structType") + nameSuffix).c_str());
		StructType* const subStructType		= new StructType((string("subStructType") + nameSuffix).c_str());
		StructType* const subSubStructType	= new StructType((string("subSubStructType") + nameSuffix).c_str());

		subSubStructType->addMember("mss0", glu::VarType(type0, prec0));
		subSubStructType->addMember("mss1", glu::VarType(type1, prec1));

		subStructType->addMember("ms0", glu::VarType(type1, prec1));
		subStructType->addMember("ms1", glu::VarType(glu::VarType(type0, prec0), 2));
		subStructType->addMember("ms2", glu::VarType(glu::VarType(subSubStructType), 2));

		structType->addMember("m0", glu::VarType(type0, prec0));
		structType->addMember("m1", glu::VarType(subStructType));
		structType->addMember("m2", glu::VarType(type1, prec1));

		res->addStructType(subSubStructType);
		res->addStructType(subStructType);
		res->addStructType(structType);

		res->addUniform(Uniform((string("u_var") + nameSuffix).c_str(), glu::VarType(structType)));

		return res;
	}